

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortSuccessor
          (BytewiseComparatorImpl *this,string *key)

{
  char cVar1;
  long lVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  long in_FS_OFFSET;
  uint8_t byte;
  size_t i;
  size_t n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     (in_stack_ffffffffffffffc8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    if (pbVar4 <= this_00) {
LAB_018ca85d:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](this_00,CONCAT17(in_stack_ffffffffffffffd7,
                                         CONCAT16(in_stack_ffffffffffffffd6,
                                                  in_stack_ffffffffffffffd0)));
    cVar1 = *pvVar5;
    if (cVar1 != -1) {
      cVar3 = cVar1 + '\x01';
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](this_00,CONCAT17(cVar1,CONCAT16(cVar3,in_stack_ffffffffffffffd0)));
      *pvVar5 = cVar3;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffffc8,0x18ca849);
      goto LAB_018ca85d;
    }
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(this_00->_M_dataplus)._M_p + 1);
    in_stack_ffffffffffffffd7 = 0xff;
  } while( true );
}

Assistant:

void FindShortSuccessor(std::string* key) const override {
    // Find first character that can be incremented
    size_t n = key->size();
    for (size_t i = 0; i < n; i++) {
      const uint8_t byte = (*key)[i];
      if (byte != static_cast<uint8_t>(0xff)) {
        (*key)[i] = byte + 1;
        key->resize(i + 1);
        return;
      }
    }
    // *key is a run of 0xffs.  Leave it alone.
  }